

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_tri_centroid(REF_NODE ref_node,REF_INT *nodes,REF_DBL *centroid)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  REF_GLOB *pRVar5;
  REF_DBL *pRVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  iVar1 = *nodes;
  if (((-1 < (long)iVar1) && (iVar2 = ref_node->max, iVar1 < iVar2)) &&
     (pRVar5 = ref_node->global, -1 < pRVar5[iVar1])) {
    uVar3 = nodes[1];
    if (((int)uVar3 < iVar2 && -1 < (int)uVar3) && (-1 < pRVar5[uVar3])) {
      uVar4 = nodes[2];
      if (((int)uVar4 < iVar2 && -1 < (int)uVar4) && (-1 < pRVar5[uVar4])) {
        pRVar6 = ref_node->real;
        uVar7 = (ulong)(uint)(iVar1 * 0xf);
        uVar8 = (ulong)(uVar3 * 0xf);
        uVar9 = (ulong)(uVar4 * 0xf);
        *centroid = (pRVar6[uVar7] + pRVar6[uVar8] + pRVar6[uVar9]) / 3.0;
        centroid[1] = (pRVar6[uVar7 + 1] + pRVar6[uVar8 + 1] + pRVar6[uVar9 + 1]) / 3.0;
        centroid[2] = (pRVar6[uVar7 + 2] + pRVar6[uVar8 + 2] + pRVar6[uVar9 + 2]) / 3.0;
        return 0;
      }
    }
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x8e7,
         "ref_node_tri_centroid",3,"node invalid");
  return 3;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_centroid(REF_NODE ref_node, REF_INT *nodes,
                                         REF_DBL *centroid) {
  if (!ref_node_valid(ref_node, nodes[0]) ||
      !ref_node_valid(ref_node, nodes[1]) ||
      !ref_node_valid(ref_node, nodes[2]))
    RSS(REF_INVALID, "node invalid");

  centroid[0] = (ref_node_xyz(ref_node, 0, nodes[0]) +
                 ref_node_xyz(ref_node, 0, nodes[1]) +
                 ref_node_xyz(ref_node, 0, nodes[2])) /
                3.0;
  centroid[1] = (ref_node_xyz(ref_node, 1, nodes[0]) +
                 ref_node_xyz(ref_node, 1, nodes[1]) +
                 ref_node_xyz(ref_node, 1, nodes[2])) /
                3.0;
  centroid[2] = (ref_node_xyz(ref_node, 2, nodes[0]) +
                 ref_node_xyz(ref_node, 2, nodes[1]) +
                 ref_node_xyz(ref_node, 2, nodes[2])) /
                3.0;

  return REF_SUCCESS;
}